

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLap_K.H
# Opt level: O2

void amrex::mlndlap_fillbc_cc<double>
               (Box *vbx,Array4<double> *sigma,Box *domain,GpuArray<amrex::LinOpBCType,_3U> bclo,
               GpuArray<amrex::LinOpBCType,_3U> bchi)

{
  GpuArray<bool,_3U> bfhi;
  GpuArray<bool,_3U> bflo;
  GpuArray<bool,_3U> local_6;
  GpuArray<bool,_3U> local_3;
  
  mlndlap_bc_doit<double>(vbx,sigma,domain,&local_3,&local_6);
  return;
}

Assistant:

void mlndlap_fillbc_cc (Box const& vbx, Array4<T> const& sigma, Box const& domain,
                        GpuArray<LinOpBCType, AMREX_SPACEDIM> bclo,
                        GpuArray<LinOpBCType, AMREX_SPACEDIM> bchi) noexcept
{
    GpuArray<bool,AMREX_SPACEDIM> bflo{{AMREX_D_DECL(bclo[0] != LinOpBCType::Periodic,
                                                     bclo[1] != LinOpBCType::Periodic,
                                                     bclo[2] != LinOpBCType::Periodic)}};
    GpuArray<bool,AMREX_SPACEDIM> bfhi{{AMREX_D_DECL(bchi[0] != LinOpBCType::Periodic,
                                                     bchi[1] != LinOpBCType::Periodic,
                                                     bchi[2] != LinOpBCType::Periodic)}};
    mlndlap_bc_doit(vbx, sigma, domain, bflo, bfhi);
}